

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QString_&,_const_char_(&)[20]>::convertTo<QString>
          (QString *__return_storage_ptr__,QStringBuilder<QString_&,_const_char_(&)[20]> *this)

{
  char16_t *__dest;
  long lVar1;
  char16_t *__src;
  long lVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QChar *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (this->a->d).size + 0x13;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar2,Uninitialized);
  __dest = (__return_storage_ptr__->d).ptr;
  lVar1 = (this->a->d).size;
  if (lVar1 != 0) {
    __src = (this->a->d).ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(__dest,__src,lVar1 * 2);
  }
  local_38 = (QChar *)(__dest + lVar1);
  QVar3.m_data = *this->b;
  QVar3.m_size = 0x13;
  QAbstractConcatenable::convertFromUtf8(QVar3,&local_38);
  if (lVar2 != (long)local_38 - (long)__dest >> 1) {
    QString::resize((longlong)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }